

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O0

void * C_std::IPC::Mmap(void *addr,size_t length,int prot,int flags,int fd,off_t offset)

{
  allocator local_59;
  string local_58 [32];
  void *local_38;
  void *p;
  off_t offset_local;
  int local_20;
  int fd_local;
  int flags_local;
  int prot_local;
  size_t length_local;
  void *addr_local;
  
  p = (void *)offset;
  offset_local._4_4_ = fd;
  local_20 = flags;
  fd_local = prot;
  _flags_local = length;
  length_local = (size_t)addr;
  local_38 = mmap(addr,length,prot,flags,fd,offset);
  if (local_38 == (void *)0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"mmap error",&local_59);
    perror_exit((string *)local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return local_38;
}

Assistant:

void *Mmap(void *addr, size_t length, int prot, int flags, int fd, off_t offset) {
            void *p = mmap(addr, length, prot, flags, fd, offset);
            if (p == MAP_FAILED) {
                perror_exit("mmap error");
            }
            return p;
        }